

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 cr_min,ImVec2 cr_max,bool intersect_with_current_clip_rect)

{
  int iVar1;
  ImVec4 *pIVar2;
  long lVar3;
  ImVec4 *__dest;
  int iVar4;
  int iVar5;
  undefined7 in_register_00000031;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar6 = cr_min.x;
  fVar7 = cr_min.y;
  fVar8 = cr_max.x;
  fVar9 = cr_max.y;
  fVar10 = fVar9;
  if (((int)CONCAT71(in_register_00000031,intersect_with_current_clip_rect) != 0) &&
     (lVar3 = (long)(this->_ClipRectStack).Size, lVar3 != 0)) {
    pIVar2 = (this->_ClipRectStack).Data;
    fVar10 = pIVar2[lVar3 + -1].x;
    if (pIVar2[lVar3 + -1].x <= fVar6) {
      fVar10 = fVar6;
    }
    fVar6 = pIVar2[lVar3 + -1].y;
    if (pIVar2[lVar3 + -1].y <= fVar7) {
      fVar6 = fVar7;
    }
    fVar11 = pIVar2[lVar3 + -1].z;
    if (fVar8 <= pIVar2[lVar3 + -1].z) {
      fVar11 = fVar8;
    }
    fVar7 = fVar6;
    fVar6 = fVar10;
    fVar8 = fVar11;
    fVar10 = pIVar2[lVar3 + -1].w;
    if (fVar9 <= pIVar2[lVar3 + -1].w) {
      fVar10 = fVar9;
    }
  }
  iVar5 = (this->_ClipRectStack).Size;
  iVar1 = (this->_ClipRectStack).Capacity;
  if (iVar5 == iVar1) {
    iVar5 = iVar5 + 1;
    if (iVar1 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar1 / 2 + iVar1;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar1 < iVar5) {
      __dest = (ImVec4 *)ImGui::MemAlloc((long)iVar5 << 4);
      pIVar2 = (this->_ClipRectStack).Data;
      if (pIVar2 != (ImVec4 *)0x0) {
        memcpy(__dest,pIVar2,(long)(this->_ClipRectStack).Size << 4);
      }
      ImGui::MemFree((this->_ClipRectStack).Data);
      (this->_ClipRectStack).Data = __dest;
      (this->_ClipRectStack).Capacity = iVar5;
    }
  }
  pIVar2 = (this->_ClipRectStack).Data;
  iVar5 = (this->_ClipRectStack).Size;
  (this->_ClipRectStack).Size = iVar5 + 1;
  pIVar2[iVar5].x = fVar6;
  pIVar2[iVar5].y = fVar7;
  pIVar2[iVar5].z =
       (float)(~-(uint)(fVar8 <= fVar6) & (uint)fVar8 | -(uint)(fVar8 <= fVar6) & (uint)fVar6);
  pIVar2[iVar5].w =
       (float)(~-(uint)(fVar10 <= fVar7) & (uint)fVar10 | -(uint)(fVar10 <= fVar7) & (uint)fVar7);
  UpdateClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(ImVec2 cr_min, ImVec2 cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect && _ClipRectStack.Size)
    {
        ImVec4 current = _ClipRectStack.Data[_ClipRectStack.Size-1];
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    UpdateClipRect();
}